

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O0

void asm_fusefref(ASMState *as,IRIns *ir,RegSet allow)

{
  Reg RVar1;
  ushort *in_RSI;
  long in_RDI;
  IRIns *op1;
  RegSet in_stack_ffffffffffffffd8;
  IRRef in_stack_ffffffffffffffdc;
  ASMState *in_stack_ffffffffffffffe0;
  
  *(undefined1 *)(in_RDI + 0xa5) = 0x80;
  if (*in_RSI == 0x7fff) {
    *(uint *)(in_RDI + 0xa0) = (uint)in_RSI[1] * 4 + (int)*(undefined8 *)(in_RDI + 0x98) + -0x288;
    *(undefined1 *)(in_RDI + 0xa4) = 0x80;
  }
  else {
    *(uint *)(in_RDI + 0xa0) =
         (uint)"\f\b\x10\x06,\x10\b\x14\x18\x1c\x06\x10\x06\x18\x06\b\b\b\f"[in_RSI[1]];
    if (*in_RSI < 0x8000) {
      *(int *)(in_RDI + 0xa0) =
           *(int *)(*(long *)(in_RDI + 0x90) + (ulong)*in_RSI * 8) + *(int *)(in_RDI + 0xa0);
      *(undefined1 *)(in_RDI + 0xa4) = 0x80;
    }
    else {
      RVar1 = ra_alloc1(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                        in_stack_ffffffffffffffd8);
      *(char *)(in_RDI + 0xa4) = (char)RVar1;
    }
  }
  return;
}

Assistant:

static void asm_fusefref(ASMState *as, IRIns *ir, RegSet allow)
{
  lj_assertA(ir->o == IR_FLOAD || ir->o == IR_FREF,
	     "bad IR op %d", ir->o);
  as->mrm.idx = RID_NONE;
  if (ir->op1 == REF_NIL) {  /* FLOAD from GG_State with offset. */
#if LJ_GC64
    as->mrm.ofs = (int32_t)(ir->op2 << 2) - GG_OFS(dispatch);
    as->mrm.base = RID_DISPATCH;
#else
    as->mrm.ofs = (int32_t)(ir->op2 << 2) + ptr2addr(J2GG(as->J));
    as->mrm.base = RID_NONE;
#endif
    return;
  }
  as->mrm.ofs = field_ofs[ir->op2];
  if (irref_isk(ir->op1)) {
    IRIns *op1 = IR(ir->op1);
#if LJ_GC64
    if (ir->op1 == REF_NIL) {
      as->mrm.ofs -= GG_OFS(dispatch);
      as->mrm.base = RID_DISPATCH;
      return;
    } else if (op1->o == IR_KPTR || op1->o == IR_KKPTR) {
      intptr_t ofs = dispofs(as, ir_kptr(op1));
      if (checki32(as->mrm.ofs + ofs)) {
	as->mrm.ofs += (int32_t)ofs;
	as->mrm.base = RID_DISPATCH;
	return;
      }
    }
#else
    as->mrm.ofs += op1->i;
    as->mrm.base = RID_NONE;
    return;
#endif
  }
  as->mrm.base = (uint8_t)ra_alloc1(as, ir->op1, allow);
}